

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::visitTerExpr(CheckerVisitor *this,TerExpr *expr)

{
  pointer *ppSVar1;
  iterator __position;
  VarScope *this_00;
  VarScope *thenScope;
  VarScope *other;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StackSlot local_38;
  
  checkTernaryPriority(this,expr);
  checkSameValues(this,expr);
  checkAlwaysTrueOrFalse(this,expr->_a);
  checkCanBeSimplified(this,expr);
  local_38.sst = SST_NODE;
  __position._M_current =
       (this->nodeStack).
       super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.field_1 = (anon_union_8_2_108c9717_for_StackSlot_1)expr;
  if (__position._M_current ==
      (this->nodeStack).
      super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::_M_realloc_insert<SQCompilation::CheckerVisitor::StackSlot>
              (&this->nodeStack,__position,&local_38);
  }
  else {
    *(ulong *)__position._M_current = (ulong)(uint)local_38._4_4_ << 0x20;
    ((__position._M_current)->field_1).n = (Node *)expr;
    ppSVar1 = &(this->nodeStack).
               super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  Node::visit<SQCompilation::CheckerVisitor>(&expr->_a->super_Node,this);
  this_00 = this->currentScope;
  iVar2 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
  thenScope = (VarScope *)CONCAT44(extraout_var,iVar2);
  iVar2 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
  other = (VarScope *)CONCAT44(extraout_var_00,iVar2);
  speculateIfConditionHeuristics
            (this,expr->_a,thenScope,(VarScope *)CONCAT44(extraout_var_00,iVar2),false);
  this->currentScope = thenScope;
  Node::visit<SQCompilation::CheckerVisitor>(&expr->_b->super_Node,this);
  this->currentScope = other;
  Node::visit<SQCompilation::CheckerVisitor>(&expr->_c->super_Node,this);
  ppSVar1 = &(this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppSVar1 = *ppSVar1 + -1;
  VarScope::merge(thenScope,other);
  VarScope::copyFrom(this_00,thenScope);
  VarScope::~VarScope(thenScope);
  VarScope::~VarScope(other);
  this->currentScope = this_00;
  return;
}

Assistant:

void CheckerVisitor::visitTerExpr(TerExpr *expr) {
  checkTernaryPriority(expr);
  checkSameValues(expr);
  checkAlwaysTrueOrFalse(expr);
  checkCanBeSimplified(expr);

  nodeStack.push_back({ SST_NODE, expr });

  expr->a()->visit(this);

  VarScope *trunkScope = currentScope;

  VarScope *ifTrueScope = trunkScope->copy(arena);
  VarScope *ifFalseScope = trunkScope->copy(arena);

  speculateIfConditionHeuristics(expr->a(), ifTrueScope, ifFalseScope);

  currentScope = ifTrueScope;
  expr->b()->visit(this);

  currentScope = ifFalseScope;
  expr->c()->visit(this);

  nodeStack.pop_back();

  ifTrueScope->merge(ifFalseScope);

  trunkScope->copyFrom(ifTrueScope);

  ifTrueScope->~VarScope();
  ifFalseScope->~VarScope();

  currentScope = trunkScope;
}